

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O0

void asn1_put_length(uchar **pp,int length)

{
  byte *pbVar1;
  int iVar2;
  int local_28;
  int local_24;
  int l;
  int i;
  uchar *p;
  int length_local;
  uchar **pp_local;
  
  pbVar1 = *pp;
  if (length < 0x80) {
    _l = pbVar1 + 1;
    *pbVar1 = (byte)length;
  }
  else {
    local_24 = 0;
    for (local_28 = length; iVar2 = local_24, 0 < local_28; local_28 = local_28 >> 8) {
      local_24 = local_24 + 1;
    }
    *pbVar1 = (byte)local_24 | 0x80;
    p._4_4_ = length;
    while (0 < local_24) {
      pbVar1[(long)(local_24 + -1) + 1] = (byte)p._4_4_;
      p._4_4_ = p._4_4_ >> 8;
      local_24 = local_24 + -1;
    }
    _l = pbVar1 + (long)iVar2 + 1;
  }
  *pp = _l;
  return;
}

Assistant:

static void asn1_put_length(unsigned char **pp, int length) {
  unsigned char *p = *pp;
  int i, l;
  if (length <= 127) {
    *(p++) = (unsigned char)length;
  } else {
    l = length;
    for (i = 0; l > 0; i++) {
      l >>= 8;
    }
    *(p++) = i | 0x80;
    l = i;
    while (i-- > 0) {
      p[i] = length & 0xff;
      length >>= 8;
    }
    p += l;
  }
  *pp = p;
}